

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLEulerAngles.cpp
# Opt level: O0

Matrix33 *
AML::eulerAngleRatesMatrix_XZY(Matrix33 *__return_storage_ptr__,double phi,double theta,double psi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_98;
  double data [3] [3];
  double secTheta;
  double sinTheta;
  double cosTheta;
  double sinPhi;
  double cosPhi;
  double psi_local;
  double theta_local;
  double phi_local;
  
  dVar1 = cos(phi);
  dVar2 = sin(phi);
  dVar3 = cos(theta);
  dVar4 = sin(theta);
  dVar5 = 1.0 / dVar3;
  local_98 = dVar3 * dVar5;
  data[0][0] = -dVar1 * dVar4 * dVar5;
  data[0][1] = dVar2 * dVar4 * dVar5;
  data[0][2] = 0.0;
  data[1][0] = dVar2 * dVar3 * dVar5;
  data[1][1] = dVar1 * dVar3 * dVar5;
  data[1][2] = 0.0;
  data[2][0] = dVar1 * dVar5;
  data[2][1] = -dVar2 * dVar5;
  Matrix33::Matrix33(__return_storage_ptr__,(double (*) [3])&local_98);
  return __return_storage_ptr__;
}

Assistant:

Matrix33 eulerAngleRatesMatrix_XZY(double phi, double theta, double psi)
    {
        const double cosPhi = cos(phi);
        const double sinPhi = sin(phi);
        const double cosTheta = cos(theta);
        const double sinTheta = sin(theta);
        const double secTheta = 1.0 / cosTheta;

        double data[3][3] = { { cosTheta * secTheta, -cosPhi * sinTheta * secTheta, sinPhi * sinTheta * secTheta },
                              { 0.0, sinPhi * cosTheta * secTheta, cosPhi * cosTheta * secTheta },
                              { 0.0, cosPhi * secTheta, -sinPhi * secTheta } };

        return Matrix33(data);
    }